

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBase.cpp
# Opt level: O0

Value __thiscall jbcoin::STBase::getJson(STBase *this,int param_1)

{
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  Value VVar1;
  string local_40;
  long *plStack_18;
  int param_1_local;
  STBase *this_local;
  
  plStack_18 = (long *)CONCAT44(in_register_00000034,param_1);
  this_local = this;
  (**(code **)(*plStack_18 + 0x30))();
  Json::Value::Value((Value *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  VVar1._8_8_ = extraout_RDX;
  VVar1.value_.map_ = (ObjectValues *)this;
  return VVar1;
}

Assistant:

Json::Value
STBase::getJson (int /*options*/) const
{
    return getText();
}